

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O0

ostream * __thiscall
tcu::Format::Enum<vk::VkVertexInputRate,_4UL>::toStream
          (Enum<vk::VkVertexInputRate,_4UL> *this,ostream *stream)

{
  char *stream_00;
  Hex<8UL> local_30;
  char *local_28;
  char *name;
  ostream *stream_local;
  Enum<vk::VkVertexInputRate,_4UL> *this_local;
  
  name = (char *)stream;
  stream_local = (ostream *)this;
  local_28 = (*this->m_getName)(this->m_value);
  stream_00 = name;
  if (local_28 == (char *)0x0) {
    Hex<8UL>::Hex(&local_30,(ulong)this->m_value);
    this_local = (Enum<vk::VkVertexInputRate,_4UL> *)
                 Format::operator<<((ostream *)stream_00,local_30);
  }
  else {
    this_local = (Enum<vk::VkVertexInputRate,_4UL> *)std::operator<<((ostream *)name,local_28);
  }
  return (ostream *)this_local;
}

Assistant:

std::ostream& toStream (std::ostream& stream) const
	{
		const char* name = m_getName(m_value);
		if (name)
			return stream << name;
		else
			return stream << Hex<NumBytes*2>((deUint64)m_value);
	}